

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O0

void __thiscall QLabelPrivate::sendControlEvent(QLabelPrivate *this,QEvent *e)

{
  long lVar1;
  bool bVar2;
  QPointF *coordinateOffset;
  QRectF *in_RSI;
  QLabelPrivate *in_RDI;
  long in_FS_OFFSET;
  QLabel *q;
  TextInteractionFlag in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  QFlagsStorage<Qt::TextInteractionFlag> lhs;
  QRectF *e_00;
  QLabelPrivate *this_00;
  QLabelPrivate *in_stack_ffffffffffffffb8;
  
  lhs.i = (Int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  coordinateOffset = (QPointF *)q_func(in_RDI);
  if (((*(ushort *)&in_RDI->field_0x340 >> 4 & 1) != 0) &&
     (in_RDI->control != (QWidgetTextControl *)0x0)) {
    bVar2 = ::operator==((QFlags<Qt::TextInteractionFlag>)lhs.i,in_stack_ffffffffffffff80);
    if (!bVar2) {
      e_00 = in_RSI;
      layoutRect(in_stack_ffffffffffffffb8);
      QRectF::topLeft(in_RSI);
      ::operator-((QPointF *)in_RSI);
      QWidgetTextControl::processEvent
                ((QWidgetTextControl *)this_00,(QEvent *)e_00,coordinateOffset,(QWidget *)in_RDI);
      goto LAB_005b099e;
    }
  }
  QEvent::ignore((QEvent *)in_RSI);
LAB_005b099e:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLabelPrivate::sendControlEvent(QEvent *e)
{
    Q_Q(QLabel);
    if (!isTextLabel || !control || textInteractionFlags == Qt::NoTextInteraction) {
        e->ignore();
        return;
    }
    control->processEvent(e, -layoutRect().topLeft(), q);
}